

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

void __thiscall
absl::Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Flag
          (Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,char *name,char *type,char *help,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value)

{
  element_type *peVar1;
  allocator<char> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  FlagFunc *in_stack_fffffffffffffef8;
  FlagFunc *in_stack_ffffffffffffff00;
  string *this_00;
  string *name_00;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff18;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff20;
  char *__s;
  shared_ptr<absl::internal::FlagFunc> local_98;
  allocator<char> local_81;
  string local_80 [24];
  string *in_stack_ffffffffffffff98;
  string local_58 [56];
  allocator<char> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  char *local_10;
  
  *in_RDI = &PTR__Flag_006f02d8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_R8);
  operator_new(0x58);
  internal::FlagFunc::FlagFunc(in_stack_ffffffffffffff00);
  std::shared_ptr<absl::internal::FlagFunc>::shared_ptr<absl::internal::FlagFunc,void>
            ((shared_ptr<absl::internal::FlagFunc> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  __s = (char *)(in_RDI + 5);
  peVar1 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x402d2a);
  peVar1->name = local_10;
  peVar1 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x402d49);
  peVar1->help = (char *)local_20;
  peVar1 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x402d69);
  peVar1->type = (char *)local_18;
  internal::(anonymous_namespace)::to_str<std::__cxx11::string>(in_stack_ffffffffffffff98);
  name_00 = (string *)(in_RDI + 5);
  peVar1 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x402d9c);
  this_00 = local_58;
  std::__cxx11::string::operator=((string *)&peVar1->default_value,this_00);
  std::__cxx11::string::~string(this_00);
  std::__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x402dd6);
  std::function<void(std::__cxx11::string_const&)>::operator=
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_18,__s,local_20);
  std::shared_ptr<absl::internal::FlagFunc>::shared_ptr
            (&local_98,(shared_ptr<absl::internal::FlagFunc> *)in_stack_fffffffffffffef8);
  internal::RegisterFlag(name_00,(shared_ptr<absl::internal::FlagFunc> *)this_00);
  std::shared_ptr<absl::internal::FlagFunc>::~shared_ptr
            ((shared_ptr<absl::internal::FlagFunc> *)0x402e58);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

Flag<T>::Flag(const char *name, const char *type, const char *help,
              const T &default_value)
    : value_(default_value), func_(new internal::FlagFunc) {
  func_->name = name;
  func_->help = help;
  func_->type = type;
  func_->default_value = internal::to_str<T>(default_value);
  func_->set_value = [this](const std::string &value) {
    this->set_value_as_str(value);
  };
  RegisterFlag(name, func_);
}